

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteractionsFrom
          (BinaryPolynomialModel<unsigned_int,_double> *this,
          PolynomialKeyList<unsigned_int> *key_list,PolynomialValueList<double> *value_list,
          Vartype vartype)

{
  runtime_error *this_00;
  pointer pvVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  pointer pvVar4;
  long lVar5;
  
  pvVar4 = (key_list->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (key_list->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pvVar1 - (long)pvVar4) / 0x18 ==
      (long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    lVar3 = 0;
    lVar5 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(((long)pvVar1 - (long)pvVar4) / 0x18); uVar2 = uVar2 + 1) {
      AddInteraction(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)&(pvVar4->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data + lVar3),
                     (double *)
                     ((long)(value_list->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar5),vartype);
      pvVar4 = (key_list->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (key_list->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 8;
      lVar3 = lVar3 + 0x18;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The sizes of key_list and value_list must match each other");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AddInteractionsFrom(
        PolynomialKeyList<IndexType> &key_list,
        const PolynomialValueList<FloatType> &value_list,
        const Vartype vartype = Vartype::NONE ) {
      if ( key_list.size() != value_list.size() ) {
        throw std::runtime_error( "The sizes of key_list and value_list must match each other" );
      }
      for ( std::size_t i = 0; i < key_list.size(); ++i ) {
        AddInteraction( key_list[ i ], value_list[ i ], vartype );
      }
    }